

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::DefaultLogDispatchCallback::dispatch(DefaultLogDispatchCallback *this,string_t *logLine)

{
  _Rb_tree_header *p_Var1;
  Level LVar2;
  LogMessage *pLVar3;
  TypedConfigurations *pTVar4;
  Logger *pLVar5;
  undefined8 in_RAX;
  mapped_type *pmVar6;
  _Base_ptr *pp_Var7;
  _Base_ptr p_Var8;
  mapped_type_conflict *pmVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  uint uVar12;
  bool bVar13;
  undefined8 local_38;
  
  if (this->m_data->m_dispatchAction != NormalLog) {
    return;
  }
  pLVar3 = this->m_data->m_logMessage;
  pTVar4 = pLVar3->m_logger->m_typedConfigurations;
  LVar2 = pLVar3->m_level;
  local_38 = in_RAX;
  (*(pTVar4->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar4);
  p_Var10 = (pTVar4->m_toFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var10 == (_Base_ptr)0x0) {
LAB_001399d0:
    local_38 = CONCAT62(local_38._2_6_,1);
    pmVar6 = std::
             map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
             ::at(&pTVar4->m_toFileMap,(key_type *)&local_38);
    if (*pmVar6 != false) {
LAB_001399ed:
      pLVar3 = this->m_data->m_logMessage;
      pTVar4 = pLVar3->m_logger->m_typedConfigurations;
      LVar2 = pLVar3->m_level;
      (*(pTVar4->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar4);
      p_Var10 = (pTVar4->m_fileStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = &(pTVar4->m_fileStreamMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = &p_Var1->_M_header;
      if (p_Var10 == (_Base_ptr)0x0) {
LAB_00139a44:
        local_38._0_4_ = CONCAT22(1,(key_type)local_38);
        pp_Var7 = (_Base_ptr *)
                  std::
                  map<el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
                  ::at(&pTVar4->m_fileStreamMap,(key_type *)((long)&local_38 + 2));
      }
      else {
        do {
          bVar13 = (Level)p_Var10[1]._M_color < LVar2;
          if (!bVar13) {
            p_Var8 = p_Var10;
          }
          p_Var10 = (&p_Var10->_M_left)[bVar13];
        } while (p_Var10 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var8 == p_Var1) || (LVar2 < (Level)p_Var8[1]._M_color))
        goto LAB_00139a44;
        pp_Var7 = &p_Var8[1]._M_parent;
      }
      p_Var10 = *pp_Var7;
      if ((p_Var10 != (_Base_ptr)0x0) &&
         (std::ostream::write((char *)&p_Var10->_M_left,(long)(logLine->_M_dataplus)._M_p),
         (*(byte *)((long)&p_Var10[1]._M_color + *(long *)(*(long *)p_Var10 + -0x18)) & 5) == 0)) {
        if ((*(byte *)(elStorage + 0x20) & 0x10) == 0) {
          pLVar3 = this->m_data->m_logMessage;
          pLVar5 = pLVar3->m_logger;
          LVar2 = pLVar3->m_level;
          p_Var8 = (pLVar5->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
          ;
          p_Var10 = &(pLVar5->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header;
          p_Var11 = p_Var10;
          if (p_Var8 != (_Base_ptr)0x0) {
            do {
              bVar13 = (Level)p_Var8[1]._M_color < LVar2;
              if (!bVar13) {
                p_Var11 = p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[bVar13];
            } while (p_Var8 != (_Base_ptr)0x0);
            if ((p_Var11 != p_Var10) && ((Level)p_Var11[1]._M_color <= LVar2)) {
              p_Var10 = p_Var11;
            }
          }
          uVar12 = *(int *)&p_Var10[1].field_0x4 + 1;
          *(uint *)&p_Var10[1].field_0x4 = uVar12;
          pTVar4 = pLVar5->m_typedConfigurations;
          (*(pTVar4->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar4);
          p_Var10 = (pTVar4->m_logFlushThresholdMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent;
          if (p_Var10 == (_Base_ptr)0x0) {
LAB_00139b43:
            local_38._0_6_ = CONCAT24(1,(undefined4)local_38);
            pmVar9 = std::
                     map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                     ::at(&pTVar4->m_logFlushThresholdMap,(key_type *)((long)&local_38 + 4));
            p_Var10 = (_Base_ptr)*pmVar9;
          }
          else {
            p_Var1 = &(pTVar4->m_logFlushThresholdMap)._M_t._M_impl.super__Rb_tree_header;
            p_Var8 = &p_Var1->_M_header;
            do {
              bVar13 = (Level)p_Var10[1]._M_color < LVar2;
              if (!bVar13) {
                p_Var8 = p_Var10;
              }
              p_Var10 = (&p_Var10->_M_left)[bVar13];
            } while (p_Var10 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var8 == p_Var1) || (LVar2 < (Level)p_Var8[1]._M_color))
            goto LAB_00139b43;
            p_Var10 = p_Var8[1]._M_parent;
          }
          if ((_Base_ptr)(ulong)uVar12 < p_Var10) goto LAB_00139bcd;
        }
        pLVar3 = this->m_data->m_logMessage;
        pLVar5 = pLVar3->m_logger;
        LVar2 = pLVar3->m_level;
        std::ostream::flush();
        p_Var10 = (pLVar5->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &(pLVar5->m_unflushedCount)._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var8 = p_Var11;
        if (p_Var10 != (_Base_ptr)0x0) {
          do {
            bVar13 = (Level)p_Var10[1]._M_color < LVar2;
            if (!bVar13) {
              p_Var8 = p_Var10;
            }
            p_Var10 = (&p_Var10->_M_left)[bVar13];
          } while (p_Var10 != (_Base_ptr)0x0);
          if ((p_Var8 != p_Var11) && ((Level)p_Var8[1]._M_color <= LVar2)) {
            p_Var11 = p_Var8;
          }
        }
        *(undefined4 *)&p_Var11[1].field_0x4 = 0;
      }
    }
  }
  else {
    p_Var1 = &(pTVar4->m_toFileMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      bVar13 = (Level)p_Var10[1]._M_color < LVar2;
      if (!bVar13) {
        p_Var8 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[bVar13];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 == p_Var1) || (LVar2 < (Level)p_Var8[1]._M_color))
    goto LAB_001399d0;
    if (*(byte *)((long)&p_Var8[1]._M_color + 2) == 1) goto LAB_001399ed;
  }
LAB_00139bcd:
  pLVar3 = this->m_data->m_logMessage;
  pTVar4 = pLVar3->m_logger->m_typedConfigurations;
  LVar2 = pLVar3->m_level;
  (*(pTVar4->super_ThreadSafe)._vptr_ThreadSafe[2])(pTVar4);
  p_Var10 = (pTVar4->m_toStandardOutputMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var10 != (_Base_ptr)0x0) {
    p_Var1 = &(pTVar4->m_toStandardOutputMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      bVar13 = (Level)p_Var10[1]._M_color < LVar2;
      if (!bVar13) {
        p_Var8 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[bVar13];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 != p_Var1) && ((Level)p_Var8[1]._M_color <= LVar2)) {
      if (*(byte *)((long)&p_Var8[1]._M_color + 2) != 1) {
        return;
      }
      goto LAB_00139c3f;
    }
  }
  local_38 = CONCAT26(1,(undefined6)local_38);
  pmVar6 = std::
           map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
           ::at(&pTVar4->m_toStandardOutputMap,(key_type *)((long)&local_38 + 6));
  if (*pmVar6 == false) {
    return;
  }
LAB_00139c3f:
  if ((*(byte *)(elStorage + 0x20) & 0x40) != 0) {
    pLVar3 = this->m_data->m_logMessage;
    LogBuilder::convertToColoredOutput
              ((pLVar3->m_logger->m_logBuilder).
               super___shared_ptr<el::LogBuilder,_(__gnu_cxx::_Lock_policy)2>._M_ptr,logLine,
               pLVar3->m_level);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(logLine->_M_dataplus)._M_p,logLine->_M_string_length);
  std::ostream::flush();
  return;
}

Assistant:

void dispatch(base::type::string_t&& logLine) {
    if (m_data->dispatchAction() == base::DispatchAction::NormalLog) {
      if (m_data->logMessage()->logger()->m_typedConfigurations->toFile(m_data->logMessage()->level())) {
        base::type::fstream_t* fs = m_data->logMessage()->logger()->m_typedConfigurations->fileStream(
                                      m_data->logMessage()->level());
        if (fs != nullptr) {
          fs->write(logLine.c_str(), logLine.size());
          if (fs->fail()) {
            ELPP_INTERNAL_ERROR("Unable to write log to file ["
                                << m_data->logMessage()->logger()->m_typedConfigurations->filename(m_data->logMessage()->level()) << "].\n"
                                << "Few possible reasons (could be something else):\n" << "      * Permission denied\n"
                                << "      * Disk full\n" << "      * Disk is not writable", true);
          } else {
            if (ELPP->hasFlag(LoggingFlag::ImmediateFlush)
                || (m_data->logMessage()->logger()->isFlushNeeded(m_data->logMessage()->level()))) {
              m_data->logMessage()->logger()->flush(m_data->logMessage()->level(), fs);
            }
          }
        } else {
          ELPP_INTERNAL_ERROR("Log file for [" << LevelHelper::convertToString(m_data->logMessage()->level()) << "] "
                              << "has not been configured but [TO_FILE] is configured to TRUE. [Logger ID: "
                              << m_data->logMessage()->logger()->id() << "]", false);
        }
      }
      if (m_data->logMessage()->logger()->m_typedConfigurations->toStandardOutput(m_data->logMessage()->level())) {
        if (ELPP->hasFlag(LoggingFlag::ColoredTerminalOutput))
          m_data->logMessage()->logger()->logBuilder()->convertToColoredOutput(&logLine, m_data->logMessage()->level());
        ELPP_COUT << ELPP_COUT_LINE(logLine);
      }
    }
#if defined(ELPP_SYSLOG)
    else if (m_data->dispatchAction() == base::DispatchAction::SysLog) {
      // Determine syslog priority
      int sysLogPriority = 0;
      if (m_data->logMessage()->level() == Level::Fatal)
        sysLogPriority = LOG_EMERG;
      else if (m_data->logMessage()->level() == Level::Error)
        sysLogPriority = LOG_ERR;
      else if (m_data->logMessage()->level() == Level::Warning)
        sysLogPriority = LOG_WARNING;
      else if (m_data->logMessage()->level() == Level::Info)
        sysLogPriority = LOG_INFO;
      else if (m_data->logMessage()->level() == Level::Debug)
        sysLogPriority = LOG_DEBUG;
      else
        sysLogPriority = LOG_NOTICE;
#  if defined(ELPP_UNICODE)
      char* line = base::utils::Str::wcharPtrToCharPtr(logLine.c_str());
      syslog(sysLogPriority, "%s", line);
      free(line);
#  else
      syslog(sysLogPriority, "%s", logLine.c_str());
#  endif
    }
#endif  // defined(ELPP_SYSLOG)
  }